

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

bool __thiscall CS248::Shader::setMatrixParameter(Shader *this,string *paramName,Matrix4x4 *value)

{
  double dVar1;
  double dVar2;
  double dVar3;
  GLint GVar4;
  Vector4D *pVVar5;
  int i;
  int i_00;
  float *pfVar6;
  float buf [16];
  
  pfVar6 = buf;
  for (i_00 = 0; i_00 != 4; i_00 = i_00 + 1) {
    pVVar5 = Matrix4x4::column(value,i_00);
    dVar1 = pVVar5->y;
    dVar2 = pVVar5->z;
    dVar3 = pVVar5->w;
    *pfVar6 = (float)pVVar5->x;
    pfVar6[1] = (float)dVar1;
    pfVar6[2] = (float)dVar2;
    pfVar6[3] = (float)dVar3;
    pfVar6 = pfVar6 + 4;
  }
  GVar4 = (*__glewGetUniformLocation)((this->programId_).id,(paramName->_M_dataplus)._M_p);
  if (-1 < GVar4) {
    (*__glewUniformMatrix4fv)(GVar4,1,'\0',buf);
  }
  return -1 < GVar4;
}

Assistant:

bool Shader::setMatrixParameter(const std::string& paramName, const Matrix4x4& value) {

    bool success = true;

    float buf[16];
    convertToGLMatrix(value, buf);

    int uniformLocation = glGetUniformLocation(programId_.id, paramName.c_str());

    if (uniformLocation >= 0)
        glUniformMatrix4fv(uniformLocation, 1, GL_FALSE, buf);
    else 
        success = false;

    return success;
}